

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

void __thiscall QPainterPath::addPath(QPainterPath *this,QPainterPath *other)

{
  int iVar1;
  QPainterPathPrivate *pQVar2;
  QPainterPathPrivate *pQVar3;
  bool bVar4;
  long lVar5;
  
  bVar4 = isEmpty(other);
  if (!bVar4) {
    ensureData(this);
    detach(this);
    pQVar2 = (this->d_ptr).d.ptr;
    lVar5 = (pQVar2->elements).d.size;
    if ((pQVar2->elements).d.ptr[lVar5 + -1].type == MoveToElement) {
      QList<QPainterPath::Element>::remove(&pQVar2->elements,(char *)(lVar5 + -1));
      lVar5 = (pQVar2->elements).d.size;
    }
    pQVar3 = (other->d_ptr).d.ptr;
    iVar1 = pQVar3->cStart;
    QList<QPainterPath::Element>::append(&pQVar2->elements,&pQVar3->elements);
    pQVar2->cStart = (int)lVar5 + iVar1;
    bVar4 = QPainterPathPrivate::isClosed((other->d_ptr).d.ptr);
    pQVar2->field_0x84 = pQVar2->field_0x84 & 0xfe | bVar4;
  }
  return;
}

Assistant:

void QPainterPath::addPath(const QPainterPath &other)
{
    if (other.isEmpty())
        return;

    ensureData();
    detach();

    QPainterPathPrivate *d = d_func();
    // Remove last moveto so we don't get multiple moveto's
    if (d->elements.constLast().type == MoveToElement)
        d->elements.remove(d->elements.size()-1);

    // Locate where our own current subpath will start after the other path is added.
    int cStart = d->elements.size() + other.d_func()->cStart;
    d->elements += other.d_func()->elements;
    d->cStart = cStart;

    d->require_moveTo = other.d_func()->isClosed();
}